

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

QString * __thiscall QNetworkProxy::user(QString *__return_storage_ptr__,QNetworkProxy *this)

{
  QNetworkProxyPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QNetworkProxyPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(pQVar1->user).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QNetworkProxy::user() const
{
    return d ? d->user : QString();
}